

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.h
# Opt level: O0

int __thiscall Sequence::get_file_l2(Sequence *this)

{
  element_type *peVar1;
  element_type *peVar2;
  ostream *this_00;
  void *this_01;
  int local_14;
  Sequence *pSStack_10;
  int l2cnt;
  Sequence *this_local;
  
  local_14 = 0;
  pSStack_10 = this;
  peVar1 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->args);
  if (1 < peVar1->max_iset_len) {
    peVar2 = std::__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->invdb);
    peVar1 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->args);
    InvertDatabase::get_l2file(peVar2,&peVar1->it2f,'\0',&local_14);
  }
  peVar1 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->args);
  if (1 < peVar1->max_seq_len) {
    peVar2 = std::__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->invdb);
    peVar1 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->args);
    InvertDatabase::get_l2file(peVar2,&peVar1->seqf,'\x01',&local_14);
  }
  this_00 = std::operator<<((ostream *)&std::cerr,"L2 : ");
  this_01 = (void *)std::ostream::operator<<(this_00,local_14);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  return local_14;
}

Assistant:

int get_file_l2() {
        int l2cnt = 0;

        if (args->max_iset_len > 1) {
            invdb->get_l2file(args->it2f, 0, l2cnt);
        }
        if (args->max_seq_len > 1) {
            invdb->get_l2file(args->seqf, 1, l2cnt);
        }

        cerr << "L2 : " << l2cnt << endl;
        return l2cnt;
    }